

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NurbsSurfaceGeometry.h
# Opt level: O1

void __thiscall
anurbs::NurbsSurfaceGeometry<2L>::NurbsSurfaceGeometry
          (NurbsSurfaceGeometry<2L> *this,Index degree_u,Index degree_v,VectorXd *knots_u,
          VectorXd *knots_v,
          vector<std::pair<Eigen::Matrix<double,_1,_2,_1,_1,_2>,_double>,_std::allocator<std::pair<Eigen::Matrix<double,_1,_2,_1,_1,_2>,_double>_>_>
          *control_points)

{
  Poles *this_00;
  double *pdVar1;
  pointer ppVar2;
  double dVar3;
  int iVar4;
  int iVar5;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  runtime_error *this_01;
  long lVar6;
  pointer ppVar7;
  long lVar8;
  DstEvaluatorType dstEvaluator;
  XprType local_70;
  block_evaluator<Eigen::Matrix<double,__1,_2,_1,__1,_2>,_1,_2,_true,_true> local_40;
  
  (this->super_SurfaceBase<2L>)._vptr_SurfaceBase =
       (_func_int **)&PTR__NurbsSurfaceGeometry_003849e0;
  this->m_degree_u = degree_u;
  this->m_degree_v = degree_v;
  this->m_nb_poles_u =
       ((knots_u->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows -
       degree_u) + 1;
  this->m_nb_poles_v =
       ((knots_v->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows -
       degree_v) + 1;
  Eigen::DenseStorage<double,_-1,_-1,_1,_0>::DenseStorage
            ((DenseStorage<double,__1,__1,_1,_0> *)&this->m_knots_u,
             (DenseStorage<double,__1,__1,_1,_0> *)knots_u);
  Eigen::DenseStorage<double,_-1,_-1,_1,_0>::DenseStorage
            ((DenseStorage<double,__1,__1,_1,_0> *)&this->m_knots_v,
             (DenseStorage<double,__1,__1,_1,_0> *)knots_v);
  lVar8 = (long)(control_points->
                super__Vector_base<std::pair<Eigen::Matrix<double,_1,_2,_1,_1,_2>,_double>,_std::allocator<std::pair<Eigen::Matrix<double,_1,_2,_1,_1,_2>,_double>_>_>
                )._M_impl.super__Vector_impl_data._M_finish -
          (long)(control_points->
                super__Vector_base<std::pair<Eigen::Matrix<double,_1,_2,_1,_1,_2>,_double>,_std::allocator<std::pair<Eigen::Matrix<double,_1,_2,_1,_1,_2>,_double>_>_>
                )._M_impl.super__Vector_impl_data._M_start;
  lVar6 = lVar8 >> 5;
  (this->m_poles).super_PlainObjectBase<Eigen::Matrix<double,__1,_2,_1,__1,_2>_>.m_storage.m_data =
       (double *)0x0;
  (this->m_poles).super_PlainObjectBase<Eigen::Matrix<double,__1,_2,_1,__1,_2>_>.m_storage.m_rows =
       0;
  if (lVar6 < 0) {
    __assert_fail("(!(RowsAtCompileTime!=Dynamic) || (rows==RowsAtCompileTime)) && (!(ColsAtCompileTime!=Dynamic) || (cols==ColsAtCompileTime)) && (!(RowsAtCompileTime==Dynamic && MaxRowsAtCompileTime!=Dynamic) || (rows<=MaxRowsAtCompileTime)) && (!(ColsAtCompileTime==Dynamic && MaxColsAtCompileTime!=Dynamic) || (cols<=MaxColsAtCompileTime)) && rows>=0 && cols>=0 && \"Invalid sizes when resizing a matrix or array.\""
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/oberbichler[P]ANurbs/external_libraries/Eigen/src/Core/PlainObjectBase.h"
                  ,0x11d,
                  "void Eigen::PlainObjectBase<Eigen::Matrix<double, -1, 2>>::resize(Index, Index) [Derived = Eigen::Matrix<double, -1, 2>]"
                 );
  }
  this_00 = &this->m_poles;
  Eigen::DenseStorage<double,_-1,_-1,_2,_1>::resize
            ((DenseStorage<double,__1,__1,_2,_1> *)this_00,lVar8 >> 4,lVar6,2);
  lVar6 = (long)(control_points->
                super__Vector_base<std::pair<Eigen::Matrix<double,_1,_2,_1,_1,_2>,_double>,_std::allocator<std::pair<Eigen::Matrix<double,_1,_2,_1,_1,_2>,_double>_>_>
                )._M_impl.super__Vector_impl_data._M_finish -
          (long)(control_points->
                super__Vector_base<std::pair<Eigen::Matrix<double,_1,_2,_1,_1,_2>,_double>,_std::allocator<std::pair<Eigen::Matrix<double,_1,_2,_1,_1,_2>,_double>_>_>
                )._M_impl.super__Vector_impl_data._M_start >> 5;
  (this->m_weights).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data
       = (double *)0x0;
  (this->m_weights).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows
       = 0;
  if (lVar6 < 0) {
    __assert_fail("((SizeAtCompileTime == Dynamic && (MaxSizeAtCompileTime==Dynamic || size<=MaxSizeAtCompileTime)) || SizeAtCompileTime == size) && size>=0"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/oberbichler[P]ANurbs/external_libraries/Eigen/src/Core/PlainObjectBase.h"
                  ,0x138,
                  "void Eigen::PlainObjectBase<Eigen::Matrix<double, -1, 1>>::resize(Index) [Derived = Eigen::Matrix<double, -1, 1>]"
                 );
  }
  Eigen::DenseStorage<double,_-1,_-1,_1,_0>::resize
            ((DenseStorage<double,__1,__1,_1,_0> *)&this->m_weights,lVar6,lVar6,1);
  lVar6 = (this->m_knots_u).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage
          .m_rows;
  iVar4 = (*(this->super_SurfaceBase<2L>)._vptr_SurfaceBase[2])(this);
  lVar8 = (this->m_knots_v).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage
          .m_rows;
  iVar5 = (*(this->super_SurfaceBase<2L>)._vptr_SurfaceBase[3])(this);
  if (((lVar8 - CONCAT44(extraout_var_00,iVar5)) + 1) * ((lVar6 - CONCAT44(extraout_var,iVar4)) + 1)
      - ((long)(control_points->
               super__Vector_base<std::pair<Eigen::Matrix<double,_1,_2,_1,_1,_2>,_double>,_std::allocator<std::pair<Eigen::Matrix<double,_1,_2,_1,_1,_2>,_double>_>_>
               )._M_impl.super__Vector_impl_data._M_finish -
         (long)(control_points->
               super__Vector_base<std::pair<Eigen::Matrix<double,_1,_2,_1,_1,_2>,_double>,_std::allocator<std::pair<Eigen::Matrix<double,_1,_2,_1,_1,_2>,_double>_>_>
               )._M_impl.super__Vector_impl_data._M_start >> 5) != 0) {
    this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_01,"Number of knots and control points do not match");
    __cxa_throw(this_01,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  ppVar7 = (control_points->
           super__Vector_base<std::pair<Eigen::Matrix<double,_1,_2,_1,_1,_2>,_double>,_std::allocator<std::pair<Eigen::Matrix<double,_1,_2,_1,_1,_2>,_double>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  ppVar2 = (control_points->
           super__Vector_base<std::pair<Eigen::Matrix<double,_1,_2,_1,_1,_2>,_double>,_std::allocator<std::pair<Eigen::Matrix<double,_1,_2,_1,_1,_2>,_double>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  if (ppVar2 != ppVar7 && -1 < (long)ppVar2 - (long)ppVar7) {
    lVar8 = 0;
    lVar6 = 0;
    do {
      local_70.super_BlockImpl<Eigen::Matrix<double,__1,_2,_1,__1,_2>,_1,_2,_true,_Eigen::Dense>.
      super_BlockImpl_dense<Eigen::Matrix<double,__1,_2,_1,__1,_2>,_1,_2,_true,_true>.
      super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,_2,_1,__1,_2>,_1,_2,_true>,_1>.
      super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,_2,_1,__1,_2>,_1,_2,_true>,_0>.m_data =
           (PointerType)
           ((long)(this->m_poles).super_PlainObjectBase<Eigen::Matrix<double,__1,_2,_1,__1,_2>_>.
                  m_storage.m_data + lVar8);
      local_70.super_BlockImpl<Eigen::Matrix<double,__1,_2,_1,__1,_2>,_1,_2,_true,_Eigen::Dense>.
      super_BlockImpl_dense<Eigen::Matrix<double,__1,_2,_1,__1,_2>,_1,_2,_true,_true>.m_startCol.
      m_value = 0;
      local_70.super_BlockImpl<Eigen::Matrix<double,__1,_2,_1,__1,_2>,_1,_2,_true,_Eigen::Dense>.
      super_BlockImpl_dense<Eigen::Matrix<double,__1,_2,_1,__1,_2>,_1,_2,_true,_true>.m_outerStride
           = 2;
      local_70.super_BlockImpl<Eigen::Matrix<double,__1,_2,_1,__1,_2>,_1,_2,_true,_Eigen::Dense>.
      super_BlockImpl_dense<Eigen::Matrix<double,__1,_2,_1,__1,_2>,_1,_2,_true,_true>.m_xpr =
           this_00;
      local_70.super_BlockImpl<Eigen::Matrix<double,__1,_2,_1,__1,_2>,_1,_2,_true,_Eigen::Dense>.
      super_BlockImpl_dense<Eigen::Matrix<double,__1,_2,_1,__1,_2>,_1,_2,_true,_true>.m_startRow.
      m_value = lVar6;
      if ((this->m_poles).super_PlainObjectBase<Eigen::Matrix<double,__1,_2,_1,__1,_2>_>.m_storage.
          m_rows <= lVar6) {
        __assert_fail("(i>=0) && ( ((BlockRows==1) && (BlockCols==XprType::ColsAtCompileTime) && i<xpr.rows()) ||((BlockRows==XprType::RowsAtCompileTime) && (BlockCols==1) && i<xpr.cols()))"
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/oberbichler[P]ANurbs/external_libraries/Eigen/src/Core/Block.h"
                      ,0x7a,
                      "Eigen::Block<Eigen::Matrix<double, -1, 2>, 1, 2, true>::Block(XprType &, Index) [XprType = Eigen::Matrix<double, -1, 2>, BlockRows = 1, BlockCols = 2, InnerPanel = true]"
                     );
      }
      Eigen::internal::block_evaluator<Eigen::Matrix<double,_-1,_2,_1,_-1,_2>,_1,_2,_true,_true>::
      block_evaluator(&local_40,&local_70);
      pdVar1 = (double *)
               ((long)(ppVar7->first).super_PlainObjectBase<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>.
                      m_storage.m_data.array + lVar8 * 2);
      dVar3 = pdVar1[1];
      *local_40.
       super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<double,__1,_2,_1,__1,_2>,_1,_2,_true>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>
       .m_data = *pdVar1;
      local_40.
      super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<double,__1,_2,_1,__1,_2>,_1,_2,_true>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>
      .m_data[1] = dVar3;
      if ((this->m_weights).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage
          .m_rows <= lVar6) {
        __assert_fail("index >= 0 && index < size()",
                      "/workspace/llm4binary/github/license_c_cmakelists/oberbichler[P]ANurbs/external_libraries/Eigen/src/Core/DenseCoeffsBase.h"
                      ,0x198,
                      "Scalar &Eigen::DenseCoeffsBase<Eigen::Matrix<double, -1, 1>, 1>::operator[](Index) [Derived = Eigen::Matrix<double, -1, 1>, Level = 1]"
                     );
      }
      (this->m_weights).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
      m_data[lVar6] =
           *(double *)
            ((long)(&((control_points->
                      super__Vector_base<std::pair<Eigen::Matrix<double,_1,_2,_1,_1,_2>,_double>,_std::allocator<std::pair<Eigen::Matrix<double,_1,_2,_1,_1,_2>,_double>_>_>
                      )._M_impl.super__Vector_impl_data._M_start)->first + 1) + lVar8 * 2);
      lVar6 = lVar6 + 1;
      ppVar7 = (control_points->
               super__Vector_base<std::pair<Eigen::Matrix<double,_1,_2,_1,_1,_2>,_double>,_std::allocator<std::pair<Eigen::Matrix<double,_1,_2,_1,_1,_2>,_double>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      lVar8 = lVar8 + 0x10;
    } while (lVar6 < (long)(control_points->
                           super__Vector_base<std::pair<Eigen::Matrix<double,_1,_2,_1,_1,_2>,_double>,_std::allocator<std::pair<Eigen::Matrix<double,_1,_2,_1,_1,_2>,_double>_>_>
                           )._M_impl.super__Vector_impl_data._M_finish - (long)ppVar7 >> 5);
  }
  return;
}

Assistant:

NurbsSurfaceGeometry(
        const Index degree_u,
        const Index degree_v,
        const Eigen::VectorXd& knots_u,
        const Eigen::VectorXd& knots_v,
        const std::vector<ControlPoint>& control_points)
        : m_degree_u(degree_u)
        , m_degree_v(degree_v)
        , m_nb_poles_u(Nurbs::nb_poles(degree_u, length(knots_u)))
        , m_nb_poles_v(Nurbs::nb_poles(degree_v, length(knots_v)))
        , m_knots_u(knots_u)
        , m_knots_v(knots_v)
        , m_poles(length(control_points), TDimension)
        , m_weights(length(control_points))
    {
        static_assert(TDimension > 0);

        if (nb_poles_u() * nb_poles_v() != length(control_points)) {
            throw std::runtime_error("Number of knots and control points do not match");
        }

        for (Index i = 0; i < length(control_points); i++) {
            m_poles.row(i) = std::get<0>(control_points[i]);
            m_weights[i] = std::get<1>(control_points[i]);
        }
    }